

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O1

void __thiscall
Hospital::Update_Bill_File
          (Hospital *this,vector<Patient,_std::allocator<Patient>_> *All_Of_Patients,
          ofstream *inFile)

{
  pointer pvVar1;
  long lVar2;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *pvVar3;
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int k;
  ulong uVar8;
  ofstream abus;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  system("pause");
  std::ofstream::ofstream(&local_230);
  std::ofstream::open((char *)&local_230,0x129188);
  if ((All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar6 = 0;
    do {
      uVar8 = 0;
      while( true ) {
        pvVar3 = Patient::Bill_Info_getter_abi_cxx11_
                           ((All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>)
                            ._M_impl.super__Vector_impl_data._M_start + uVar6);
        uVar5 = ((long)(pvVar3->
                       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pvVar3->
                       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        if (uVar5 < uVar8 || uVar5 - uVar8 == 0) break;
        lVar7 = 8;
        uVar5 = 0;
        while( true ) {
          pvVar3 = Patient::Bill_Info_getter_abi_cxx11_
                             ((All_Of_Patients->
                              super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
                              super__Vector_impl_data._M_start + uVar6);
          pvVar1 = (pvVar3->
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)*(pointer *)
                             ((long)&(pvVar1->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data + 8) -
                      *(long *)&(pvVar1->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data >> 5) <= uVar5) break;
          pvVar3 = Patient::Bill_Info_getter_abi_cxx11_
                             ((All_Of_Patients->
                              super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
                              super__Vector_impl_data._M_start + uVar6);
          lVar2 = *(long *)&(pvVar3->
                            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar8].
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data;
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_230,*(char **)(lVar2 + -8 + lVar7),
                              *(long *)(lVar2 + lVar7));
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          uVar5 = uVar5 + 1;
          lVar7 = lVar7 + 0x20;
        }
        uVar8 = uVar8 + 1;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
      uVar6 = uVar6 + 1;
      uVar8 = ((long)(All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 4) * -0x30c30c30c30c30c3;
    } while (uVar6 <= uVar8 && uVar8 - uVar6 != 0);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void Hospital:: Update_Bill_File (vector<Patient>&All_Of_Patients , ofstream& inFile) {
    system("pause");
    //  cout << "hiiiii";
    ofstream abus;
    abus.open("Bill.txt");
    //abus <<"Asghar";

    for (int i = 0; i < All_Of_Patients.size(); i++) {
        for (int j = 0; j < All_Of_Patients[i].Bill_Info_getter().size(); ++j) {
            for (int k = 0; k <All_Of_Patients[i].Bill_Info_getter()[0].size() ; ++k) {
                abus << All_Of_Patients[i].Bill_Info_getter()[j][k] << " ";
            }
//            abus <<"Asghar";
        }
        abus << "\n";
    }
    //inFile.close();

}